

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_meta___index(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  lua_State *L_00;
  CType *in_RDI;
  TValue *o;
  uint8_t *p;
  CType *ct;
  CTInfo *in_stack_00000018;
  CTInfo qual;
  CTState *cts;
  GCcdata *in_stack_00000030;
  CTState *cts_1;
  uint8_t *sp;
  TValue *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  int local_14;
  CType *ct_00;
  
  uVar5._0_2_ = in_RDI->sib;
  uVar5._2_2_ = in_RDI->next;
  uVar4 = (ulong)*(uint *)((ulong)uVar5 + 0x194);
  *(CType **)(uVar4 + 0x10) = in_RDI;
  uVar5 = 0;
  sp = *(uint8_t **)(in_RDI + 1);
  if ((sp + 8 < *(uint8_t **)&in_RDI[1].sib) && (*(int *)(sp + 4) == -0xb)) {
    ct_00 = in_RDI;
    L_00 = (lua_State *)
           lj_cdata_index(cts_1,in_stack_00000030,(cTValue *)L,(uint8_t **)cts,in_stack_00000018);
    if ((uVar5 & 1) == 0) {
      iVar3 = lj_cdata_get((CTState *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),(CType *)L_00,
                           in_stack_ffffffffffffffc0,sp);
      if ((iVar3 != 0) &&
         (uVar1._0_2_ = in_RDI->sib, uVar1._2_2_ = in_RDI->next, uVar2._0_2_ = in_RDI->sib,
         uVar2._2_2_ = in_RDI->next,
         *(uint *)((ulong)uVar2 + 0x54) <= *(uint *)((ulong)uVar1 + 0x50))) {
        lj_gc_step(L_00);
      }
      local_14 = 1;
    }
    else {
      local_14 = ffi_index_meta((lua_State *)p,(CTState *)&o->field_2,ct_00,(MMS)(uVar4 >> 0x20));
    }
    return local_14;
  }
  lj_err_argt((lua_State *)&in_stack_ffffffffffffffc0->field_2,(int)((ulong)sp >> 0x20),(int)sp);
}

Assistant:

LJLIB_CF(ffi_meta___index)	LJLIB_REC(cdata_index 0)
{
  CTState *cts = ctype_cts(L);
  CTInfo qual = 0;
  CType *ct;
  uint8_t *p;
  TValue *o = L->base;
  if (!(o+1 < L->top && tviscdata(o)))  /* Also checks for presence of key. */
    lj_err_argt(L, 1, LUA_TCDATA);
  ct = lj_cdata_index(cts, cdataV(o), o+1, &p, &qual);
  if ((qual & 1))
    return ffi_index_meta(L, cts, ct, MM_index);
  if (lj_cdata_get(cts, ct, L->top-1, p))
    lj_gc_check(L);
  return 1;
}